

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O1

void __thiscall gnilk::LogManager::AddSink(LogManager *this,Ref *sink,string *name)

{
  mutex *__mutex;
  int iVar1;
  undefined8 uVar2;
  pointer *__ptr;
  Ref sinkInstance;
  _Head_base<0UL,_gnilk::LogSinkInstance_*,_false> local_38;
  Ref local_30;
  
  __mutex = &this->sinkLock;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 == 0) {
    local_30.super___shared_ptr<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (sink->super___shared_ptr<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_30.super___shared_ptr<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (sink->super___shared_ptr<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (local_30.super___shared_ptr<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_30.super___shared_ptr<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_30.super___shared_ptr<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_30.super___shared_ptr<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (local_30.super___shared_ptr<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    LogSinkInstanceManaged::Create((LogSinkInstanceManaged *)&local_38,&local_30,name);
    if (local_30.super___shared_ptr<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_30.super___shared_ptr<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi);
    }
    std::
    vector<std::unique_ptr<gnilk::LogSinkInstance,std::default_delete<gnilk::LogSinkInstance>>,std::allocator<std::unique_ptr<gnilk::LogSinkInstance,std::default_delete<gnilk::LogSinkInstance>>>>
    ::
    emplace_back<std::unique_ptr<gnilk::LogSinkInstance,std::default_delete<gnilk::LogSinkInstance>>>
              ((vector<std::unique_ptr<gnilk::LogSinkInstance,std::default_delete<gnilk::LogSinkInstance>>,std::allocator<std::unique_ptr<gnilk::LogSinkInstance,std::default_delete<gnilk::LogSinkInstance>>>>
                *)&this->sinks,
               (unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_> *)
               &local_38);
    if (this->isInitialized == true) {
      (*((sink->super___shared_ptr<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        _vptr_LogSink[8])();
    }
    if (local_38._M_head_impl != (LogSinkInstance *)0x0) {
      (*(local_38._M_head_impl)->_vptr_LogSinkInstance[1])();
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return;
  }
  uVar2 = std::__throw_system_error(iVar1);
  if (local_30.super___shared_ptr<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  _Unwind_Resume(uVar2);
}

Assistant:

void LogManager::AddSink(LogSink::Ref sink, const std::string &name) {
    std::lock_guard<std::mutex> lock(sinkLock);
    auto sinkInstance = LogSinkInstanceManaged::Create(sink, name);
    sinks.push_back(std::move(sinkInstance));
    // FIXME: This is not good - we can't do this during initialization
    if (isInitialized) {
        sink->OnAttached();
    }
}